

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# S2Test.cpp
# Opt level: O3

void __thiscall S2NoAllocation::test_method(S2NoAllocation *this)

{
  undefined8 *puVar1;
  size_t size;
  double *__ptr;
  ulong uVar2;
  double *__ptr_00;
  ulong uVar3;
  void *pvVar4;
  char *__function;
  DstEvaluatorType dstEvaluator;
  Index cols;
  Index rows;
  VectorXd x;
  MatrixXd H0;
  VectorXd y;
  MatrixXd H2;
  MatrixXd H1;
  MatrixXd J0;
  S2 Space;
  void *local_398;
  long local_390;
  void *local_388;
  long lStack_380;
  undefined8 local_378;
  void *local_370;
  undefined8 uStack_368;
  double *local_358;
  void *local_350;
  ulong local_348;
  ulong local_340;
  void *local_338;
  long local_330;
  void *local_328;
  ulong local_320;
  ulong local_318;
  void *local_310;
  ulong local_308;
  ulong local_300;
  void *local_2f8;
  void *pvStack_2f0;
  undefined8 uStack_2e8;
  void *local_2e0;
  undefined8 uStack_2d8;
  void *local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  void *local_1c8 [3];
  S2 local_1b0 [136];
  undefined8 *local_128;
  undefined8 local_120;
  void *local_110;
  undefined8 uStack_108;
  void *local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  void *local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  void *local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  double *local_88;
  undefined8 local_80;
  ulong local_78;
  undefined8 local_70;
  double *local_60;
  size_t local_58;
  double *local_48;
  size_t local_40;
  
  mnf::S2::S2(local_1b0);
  mnf::Manifold::createRandomPoint(1.0);
  mnf::SubPoint::value();
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_398,
             (DenseBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              *)&local_388);
  mnf::ConstSubPoint::~ConstSubPoint((ConstSubPoint *)&local_2e0);
  free(pvStack_2f0);
  mnf::Manifold::createRandomPoint(1.0);
  mnf::SubPoint::value();
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_338,
             (DenseBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              *)&local_388);
  mnf::ConstSubPoint::~ConstSubPoint((ConstSubPoint *)&local_2e0);
  free(pvStack_2f0);
  local_2e0 = (void *)0x0;
  uStack_2d8 = 0;
  local_2f8 = local_398;
  pvStack_2f0 = (void *)local_390;
  if (local_390 < 0 && local_398 != (void *)0x0) goto LAB_00116deb;
  mnf::S2::randVec((Ref_conflict *)&local_388);
  if ((Eigen::internal::is_malloc_allowed_impl(bool,bool)::value & 1) == 0) {
    __assert_fail("is_malloc_allowed() && \"heap allocation is forbidden (EIGEN_RUNTIME_NO_MALLOC is defined and g_is_malloc_allowed is false)\""
                  ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xa4,
                  "void Eigen::internal::check_that_malloc_is_allowed()");
  }
  puVar1 = (undefined8 *)malloc(0x18);
  if (((ulong)puVar1 & 0xf) != 0) {
    __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                  "void *Eigen::internal::aligned_malloc(std::size_t)");
  }
  if (puVar1 == (undefined8 *)0x0) {
    puVar1 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar1 = operator_delete;
    __cxa_throw(puVar1,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  *puVar1 = local_388;
  puVar1[1] = lStack_380;
  puVar1[2] = local_378;
  free(local_2e0);
  size = mnf::Manifold::representationDim();
  if ((long)size < 0) {
    __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x130,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if (size == 0) {
    __ptr = (double *)0x0;
  }
  else {
    __ptr = Eigen::internal::conditional_aligned_new_auto<double,true>(size);
  }
  pvStack_2f0 = (void *)mnf::Manifold::representationDim();
  local_2f8 = (void *)0x3;
  if ((long)pvStack_2f0 < 0) goto LAB_00116e02;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_1c8,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_2f8);
  uVar2 = mnf::Manifold::representationDim();
  if ((long)uVar2 < 0) {
LAB_00116e40:
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  if (0x2aaaaaaaaaaaaaaa < uVar2) {
    puVar1 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar1 = operator_delete;
    __cxa_throw(puVar1,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  if (uVar2 == 0) {
    __ptr_00 = (double *)0x0;
  }
  else {
    __ptr_00 = Eigen::internal::conditional_aligned_new_auto<double,true>(uVar2 * 3);
  }
  uVar3 = mnf::Manifold::representationDim();
  if ((long)uVar3 < 0) goto LAB_00116e40;
  if (0x2aaaaaaaaaaaaaaa < uVar3) {
    puVar1 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar1 = operator_delete;
    __cxa_throw(puVar1,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  if (uVar3 == 0) {
    local_358 = (double *)0x0;
  }
  else {
    local_358 = Eigen::internal::conditional_aligned_new_auto<double,true>(uVar3 * 3);
  }
  pvVar4 = (void *)mnf::Manifold::tangentDim();
  pvStack_2f0 = (void *)mnf::Manifold::tangentDim();
  local_2f8 = pvVar4;
  if ((long)((ulong)pvStack_2f0 | (ulong)pvVar4) < 0) {
LAB_00116e02:
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_random_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_350,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_2f8);
  pvVar4 = (void *)mnf::Manifold::tangentDim();
  pvStack_2f0 = (void *)mnf::Manifold::tangentDim();
  local_2f8 = pvVar4;
  if ((long)((ulong)pvStack_2f0 | (ulong)pvVar4) < 0) goto LAB_00116e02;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_310,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_2f8);
  pvVar4 = (void *)mnf::Manifold::tangentDim();
  pvStack_2f0 = (void *)mnf::Manifold::tangentDim();
  local_2f8 = pvVar4;
  if ((long)((ulong)pvStack_2f0 | (ulong)pvVar4) < 0) goto LAB_00116e02;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_328,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_2f8);
  Eigen::internal::is_malloc_allowed_impl(bool,bool)::value = 0;
  mnf::utils::set_is_malloc_allowed(false);
  local_2e0 = (void *)0x0;
  uStack_2d8 = 0;
  local_2f8 = local_398;
  pvStack_2f0 = (void *)local_390;
  local_48 = __ptr;
  local_40 = size;
  if (-1 < local_390 || local_398 == (void *)0x0) {
    local_370 = (void *)0x0;
    uStack_368 = 0;
    lStack_380 = 3;
    local_388 = puVar1;
    mnf::Manifold::retractation(local_1b0,&local_48,&local_2f8);
    free(local_370);
    free(local_2e0);
    local_2e0 = (void *)0x0;
    uStack_2d8 = 0;
    local_2f8 = local_398;
    pvStack_2f0 = (void *)local_390;
    local_60 = __ptr;
    local_58 = size;
    if (-1 < local_390 || local_398 == (void *)0x0) {
      local_370 = (void *)0x0;
      uStack_368 = 0;
      local_388 = local_338;
      lStack_380 = local_330;
      if (-1 < local_330 || local_338 == (void *)0x0) {
        mnf::Manifold::pseudoLog(local_1b0,&local_60,&local_2f8,&local_388);
        free(local_370);
        free(local_2e0);
        local_80 = 3;
        local_70 = 3;
        uStack_2e8 = 0;
        local_2e0 = (void *)0x0;
        local_2f8 = (void *)0x0;
        pvStack_2f0 = (void *)0x0;
        local_2d0 = (void *)0x0;
        uStack_2c8 = 0;
        local_2c0 = 0;
        local_88 = __ptr_00;
        local_78 = uVar2;
        Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>::
        construct<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  ((Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>> *)
                   &local_2f8,local_1c8);
        local_370 = (void *)0x0;
        uStack_368 = 0;
        local_388 = local_398;
        lStack_380 = local_390;
        if (-1 < local_390 || local_398 == (void *)0x0) {
          mnf::Manifold::applyDiffRetractation(local_1b0,&local_88,&local_2f8,&local_388);
          free(local_370);
          free(local_2d0);
          local_e8 = 0;
          local_100 = local_310;
          local_f8 = local_308;
          local_f0 = local_300;
          if ((long)(local_300 | local_308) < 0 && local_310 != (void *)0x0) {
LAB_00116e21:
            __function = 
            "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, -1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1>>, Level = 0]"
            ;
            goto LAB_00116e36;
          }
          local_e8 = local_308;
          uStack_2e8 = 0;
          local_2e0 = (void *)0x0;
          local_2f8 = (void *)0x0;
          pvStack_2f0 = (void *)0x0;
          local_2d0 = (void *)0x0;
          uStack_2c8 = 0;
          local_2c0 = 0;
          Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>::
          construct<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                    ((Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>> *)
                     &local_2f8,&local_350);
          local_370 = (void *)0x0;
          uStack_368 = 0;
          local_388 = local_398;
          lStack_380 = local_390;
          if (-1 < local_390 || local_398 == (void *)0x0) {
            local_110 = (void *)0x0;
            uStack_108 = 0;
            local_120 = 3;
            local_128 = puVar1;
            mnf::Manifold::applyTransport(local_1b0,&local_100,&local_2f8,&local_388);
            free(local_110);
            free(local_370);
            free(local_2d0);
            local_b0 = local_328;
            local_a8 = local_320;
            local_a0 = local_318;
            if ((long)(local_318 | local_320) < 0 && local_328 != (void *)0x0) goto LAB_00116e21;
            local_98 = local_320;
            uStack_2e8 = 0;
            local_2e0 = (void *)0x0;
            local_2f8 = (void *)0x0;
            pvStack_2f0 = (void *)0x0;
            local_2d0 = (void *)0x0;
            uStack_2c8 = 0;
            local_2c0 = 0;
            Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>::
            construct<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                      ((Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>> *)
                       &local_2f8,&local_350);
            local_370 = (void *)0x0;
            uStack_368 = 0;
            local_388 = local_398;
            lStack_380 = local_390;
            if (-1 < local_390 || local_398 == (void *)0x0) {
              local_110 = (void *)0x0;
              uStack_108 = 0;
              local_120 = 3;
              local_128 = puVar1;
              mnf::Manifold::applyInvTransport(local_1b0,&local_b0,&local_2f8,&local_388);
              free(local_110);
              free(local_370);
              free(local_2d0);
              local_d8 = local_350;
              local_d0 = local_348;
              local_c8 = local_340;
              if ((long)(local_340 | local_348) < 0 && local_350 != (void *)0x0) goto LAB_00116e21;
              local_c0 = local_348;
              local_2e0 = (void *)0x0;
              uStack_2d8 = 0;
              local_2f8 = local_398;
              pvStack_2f0 = (void *)local_390;
              if (-1 < local_390 || local_398 == (void *)0x0) {
                mnf::Manifold::getIdentityOnTxM(local_1b0,&local_d8,&local_2f8);
                free(local_2e0);
                mnf::utils::set_is_malloc_allowed(true);
                Eigen::internal::is_malloc_allowed_impl(bool,bool)::value = 1;
                free(local_328);
                free(local_310);
                free(local_350);
                free(local_358);
                free(__ptr_00);
                free(local_1c8[0]);
                free(__ptr);
                free(puVar1);
                free(local_338);
                free(local_398);
                mnf::Manifold::~Manifold((Manifold *)local_1b0);
                return;
              }
            }
          }
        }
      }
    }
  }
LAB_00116deb:
  __function = 
  "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
  ;
LAB_00116e36:
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,__function);
}

Assistant:

BOOST_AUTO_TEST_CASE(S2NoAllocation)
{
  // We only test here that the operations on the manifold do not create
  // temporary. Passing arguments that are not recognize by the Eigen::Ref will
  // create temporaries, but this is the user's fault.
  S2 Space;
  Index c = 3;
  // VectorXd x = VectorXd::Random(Space.representationDim());
  // VectorXd y = VectorXd::Random(Space.representationDim());
  VectorXd x = Space.createRandomPoint().value();
  VectorXd y = Space.createRandomPoint().value();
  VectorXd vx = Space.randVec(x);
  VectorXd z(Space.representationDim());
  MatrixXd J0 = MatrixXd::Random(c, Space.representationDim());
  MatrixXd J1(c, Space.representationDim());
  MatrixXd J2(c, Space.representationDim());
  MatrixXd H0 = MatrixXd::Random(Space.tangentDim(), Space.tangentDim());
  MatrixXd H1 = MatrixXd::Random(Space.tangentDim(), Space.tangentDim());
  MatrixXd H2 = MatrixXd::Random(Space.tangentDim(), Space.tangentDim());

  internal::set_is_malloc_allowed(false);
  utils::set_is_malloc_allowed(false);
  {
    Space.retractation(z, x, vx);
    Space.pseudoLog(z, x, y);
    Space.applyDiffRetractation(J1, J0, x);
    Space.applyTransport(H1, H0, x, vx);
    Space.applyInvTransport(H2, H0, x, vx);
    Space.getIdentityOnTxM(H0, x);
  }
  utils::set_is_malloc_allowed(true);
  internal::set_is_malloc_allowed(true);
}